

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O3

char * __thiscall Fl_Comment_Type::title(Fl_Comment_Type *this)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  
  pcVar4 = (this->super_Fl_Type).name_;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])();
    return (char *)CONCAT44(extraout_var,iVar2);
  }
  pcVar5 = this->title_buf;
  pcVar3 = pcVar5;
  if (this->title_buf[0] != '\0') {
    return pcVar3;
  }
  iVar6 = 0x32;
  iVar2 = 0x31;
  do {
    cVar1 = *pcVar4;
    if (cVar1 == '\n') {
      pcVar5[0] = '\\';
      pcVar5[1] = 'n';
LAB_0017bf6c:
      pcVar5 = pcVar5 + 2;
      iVar6 = iVar6 + -2;
    }
    else {
      if (cVar1 == '\r') {
        pcVar5[0] = '\\';
        pcVar5[1] = 'r';
        goto LAB_0017bf6c;
      }
      if (cVar1 == '\0') goto LAB_0017bf99;
      if (cVar1 < ' ') {
        *pcVar5 = '^';
        pcVar5[1] = cVar1 + 'A';
        goto LAB_0017bf6c;
      }
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + 1;
      iVar6 = iVar2;
    }
    pcVar4 = pcVar4 + 1;
    iVar2 = iVar6 + -1;
  } while (1 < iVar6);
  pcVar5[0] = '.';
  pcVar5[1] = '.';
  pcVar5[2] = '.';
  pcVar5 = pcVar5 + 3;
LAB_0017bf99:
  *pcVar5 = '\0';
  return pcVar3;
}

Assistant:

const char *name() const {return name_;}